

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_rar5.c
# Opt level: O2

int verify_data(uint8_t *data_ptr,int magic,int size)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  bool bVar5;
  
  uVar2 = (ulong)((uint)size >> 2);
  iVar4 = -2;
  do {
    bVar5 = uVar2 == 0;
    uVar2 = uVar2 - 1;
    if (bVar5) {
      return 1;
    }
    uVar3 = (iVar4 + 3) * iVar4 + magic + 1;
    if ((int)uVar3 < 1) {
      uVar3 = 0;
    }
    uVar1 = i4le(data_ptr);
    iVar4 = iVar4 + 1;
    data_ptr = data_ptr + 4;
  } while (uVar1 == uVar3);
  return 0;
}

Assistant:

static
int verify_data(const uint8_t* data_ptr, int magic, int size) {
	int i = 0;

	/* This is how the test data inside test files was generated;
	 * we are re-generating it here and we check if our re-generated
	 * test data is the same as in the test file. If this test is
	 * failing it's either because there's a bug in the test case,
	 * or the unpacked data is corrupted. */

	for(i = 0; i < size / 4; ++i) {
		const int k = i + 1;
		const signed int* lptr = (const signed int*) &data_ptr[i * 4];
		signed int val = k * k - 3 * k + (1 + magic);

		if(val < 0)
			val = 0;

		/* *lptr is a value inside unpacked test file, val is the
		 * value that should be in the unpacked test file. */

		if(i4le(lptr) != (uint32_t) val)
			return 0;
	}

	return 1;
}